

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O3

bool __thiscall csm::MIC::RangeList::Range::contains(Range *this,int argVal)

{
  Data *this_00;
  Type TVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostringstream strm;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  TVar1 = (this->theMinimum).theType;
  if (TVar1 == DOUBLE_TYPE) {
    bVar2 = contains(this,(double)argVal);
    return bVar2;
  }
  if (TVar1 == INT_TYPE) {
    iVar3 = Data::intValue(&this->theMinimum);
    bVar2 = true;
    if (iVar3 != argVal) {
      iVar3 = Data::intValue(&this->theMaximum);
      if (iVar3 != argVal) {
        iVar3 = Data::intValue(&this->theMinimum);
        if ((iVar3 < argVal) && (iVar3 = Data::intValue(&this->theMaximum), argVal < iVar3)) {
          this_00 = &this->theStep;
          iVar3 = Data::intValue(this_00);
          if (iVar3 < 2) {
            return true;
          }
          iVar3 = Data::intValue(&this->theMinimum);
          iVar4 = Data::intValue(this_00);
          iVar5 = Data::intValue(&this->theMinimum);
          iVar6 = Data::intValue(this_00);
          return iVar6 * ((argVal - iVar3) / iVar4) + iVar5 == argVal;
        }
        bVar2 = false;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::operator<<((ostream *)local_198,argVal);
    std::__cxx11::stringbuf::str();
    bVar2 = contains(this,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  return bVar2;
}

Assistant:

bool RangeList::Range::contains(int argVal) const
{
   const Data::Type& currentType = type();
   
   if (currentType == Data::INT_TYPE)
   {
      if ((theMinimum.intValue() == argVal) ||
          (theMaximum.intValue() == argVal))
      {
         return true;
      }
      
      if ((theMinimum.intValue() < argVal)  &&
          (theMaximum.intValue() > argVal))
      {  
         //***
         // The step should never < 1, but if so, ignore it.
         //***
         if ((theStep.intValue() <= 1))
         {
            return true;
         }
         
         //***
         // A step size other than 1 implies that the value must be a
         // discrete step between the minimum and maximum to be in the
         // range.
         //***
         int nbrSteps = (argVal - theMinimum.intValue())/
                        theStep.intValue();
         
         return (argVal == (theMinimum.intValue() +
                            theStep.intValue() * nbrSteps));
      }
   }
   else if (currentType == Data::DOUBLE_TYPE)
   {
      return contains((double)argVal);
   }
   else // Data::STRING_TYPE
   {
      std::ostringstream strm;
      strm << argVal;
      
      return contains(strm.str());
   }
   
   return false;
}